

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_path_stroke
               (nk_draw_list *list,nk_color color,nk_draw_list_stroke closed,float thickness)

{
  nk_vec2 *points;
  
  if (list != (nk_draw_list *)0x0) {
    if (list->buffer == (nk_buffer *)0x0) {
      points = (nk_vec2 *)0x0;
    }
    else {
      points = (nk_vec2 *)(list->buffer->memory).ptr;
    }
    nk_draw_list_stroke_poly_line
              (list,points,list->path_count,color,closed,thickness,(list->config).line_AA);
    nk_draw_list_path_clear(list);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_stroke(struct nk_draw_list *list, struct nk_color color,
enum nk_draw_list_stroke closed, float thickness)
{
struct nk_vec2 *points;
NK_ASSERT(list);
if (!list) return;
points = (struct nk_vec2*)nk_buffer_memory(list->buffer);
nk_draw_list_stroke_poly_line(list, points, list->path_count, color,
closed, thickness, list->config.line_AA);
nk_draw_list_path_clear(list);
}